

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

void __thiscall
RandomizerWorld::add_custom_dialogue(RandomizerWorld *this,Entity *entity,string *text)

{
  string *__str;
  mapped_type *this_00;
  GameText local_68;
  string *local_20;
  string *text_local;
  Entity *entity_local;
  RandomizerWorld *this_local;
  
  local_20 = text;
  text_local = (string *)entity;
  entity_local = (Entity *)this;
  GameText::GameText(&local_68,text,'\x03');
  __str = GameText::get_output_abi_cxx11_(&local_68);
  this_00 = std::
            map<Entity_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Entity_*>,_std::allocator<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_custom_dialogues,(key_type *)&text_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,__str);
  GameText::~GameText(&local_68);
  return;
}

Assistant:

void RandomizerWorld::add_custom_dialogue(Entity* entity, const std::string& text)
{
    _custom_dialogues[entity] = GameText(text).get_output();
}